

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select_node.cpp
# Opt level: O1

void __thiscall
duckdb::Transformer::TransformModifiers(Transformer *this,PGSelectStmt *stmt,QueryNode *node)

{
  PGNode *pPVar1;
  __uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_> _Var2;
  undefined8 uVar3;
  pointer pOVar4;
  pointer pLVar5;
  pointer pLVar6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  templated_unique_single_t order_modifier;
  templated_unique_single_t limit_percent_modifier;
  undefined1 local_70 [16];
  pointer pOStack_60;
  pointer local_58;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_48;
  
  local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TransformOrderBy(this,stmt->sortClause,(vector<duckdb::OrderByNode,_true> *)&local_48);
  if (local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    local_70._0_8_ = operator_new(0x28);
    *(undefined1 *)(local_70._0_8_ + 8) = 2;
    *(undefined ***)local_70._0_8_ = &PTR__OrderModifier_019933b0;
    *(long *)(local_70._0_8_ + 0x10) = 0;
    *(long *)(local_70._0_8_ + 0x18) = 0;
    *(long *)(local_70._0_8_ + 0x20) = 0;
    pOVar4 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
             operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                         *)local_70);
    local_70._8_8_ =
         (pOVar4->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
         super__Vector_impl_data._M_start;
    pOStack_60 = (pOVar4->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_58 = (pOVar4->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (pOVar4->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (pOVar4->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (pOVar4->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)(local_70 + 8));
    local_70._8_8_ = local_70._0_8_;
    local_70._0_8_ = (_Head_base<0UL,_duckdb::OrderModifier_*,_false>)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)(local_70 + 8));
    if ((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
        local_70._8_8_ != (OrderModifier *)0x0) {
      (**(code **)(*(long *)local_70._8_8_ + 8))();
    }
    if ((_Head_base<0UL,_duckdb::OrderModifier_*,_false>)local_70._0_8_ !=
        (_Head_base<0UL,_duckdb::OrderModifier_*,_false>)0x0) {
      (*((BaseExpression *)local_70._0_8_)->_vptr_BaseExpression[1])();
    }
  }
  pPVar1 = stmt->limitOffset;
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
  super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl =
       (tuple<duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)stmt->limitCount
  ;
  if ((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
      _Var2._M_t.
      super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
      super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl == (OrderModifier *)0x0 &&
      pPVar1 == (PGNode *)0x0) goto LAB_007a9262;
  if (((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
       _Var2._M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl == (OrderModifier *)0x0)
     || (*(int *)_Var2._M_t.
                 super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
                 .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != 0x197)) {
    local_70._8_8_ = operator_new(0x20);
    ((BaseExpression *)&((OrderModifier *)local_70._8_8_)->super_ResultModifier)->type = 1;
    ((BaseExpression *)&((OrderModifier *)local_70._8_8_)->super_ResultModifier)->
    _vptr_BaseExpression = (_func_int **)&PTR__LimitModifier_01993360;
    (((string *)&((OrderModifier *)local_70._8_8_)->orders)->_M_dataplus)._M_p = (pointer)0x0;
    ((string *)&((OrderModifier *)local_70._8_8_)->orders)->_M_string_length = 0;
    if (stmt->offset_first == true) {
      if (pPVar1 != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_70,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar6 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_70 + 8));
        uVar3 = local_70._0_8_;
        local_70._0_8_ =
             (tuple<duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)0x0;
        _Var7._M_head_impl =
             (pLVar6->offset).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar6->offset).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar3;
        if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((OrderModifier *)local_70._0_8_ != (OrderModifier *)0x0) {
          (**(code **)((long)((BaseExpression *)local_70._0_8_)->_vptr_BaseExpression + 8))();
        }
      }
      if (stmt->limitCount != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_70,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar6 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_70 + 8));
        _Var7._M_head_impl =
             (pLVar6->limit).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar6->limit).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)local_70._0_8_;
LAB_007a9205:
        local_70._0_8_ = (OrderModifier *)0x0;
        if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)((long)((_Var7._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))
                    ();
        }
        if ((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
            local_70._0_8_ != (OrderModifier *)0x0) {
          (**(code **)(*(long *)local_70._0_8_ + 8))();
        }
      }
    }
    else {
      if ((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
          _Var2._M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
          (OrderModifier *)0x0) {
        TransformExpression((Transformer *)local_70,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar6 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_70 + 8));
        uVar3 = local_70._0_8_;
        local_70._0_8_ =
             (tuple<duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)0x0;
        _Var7._M_head_impl =
             (pLVar6->limit).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar6->limit).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar3;
        if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
        }
        if ((OrderModifier *)local_70._0_8_ != (OrderModifier *)0x0) {
          (**(code **)((long)((BaseExpression *)local_70._0_8_)->_vptr_BaseExpression + 8))();
        }
      }
      if (stmt->limitOffset != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_70,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar6 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_70 + 8));
        _Var7._M_head_impl =
             (pLVar6->offset).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar6->offset).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)local_70._0_8_;
        goto LAB_007a9205;
      }
    }
    local_70._0_8_ = local_70._8_8_;
    local_70._8_8_ = (OrderModifier *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_70);
  }
  else {
    local_70._8_8_ = operator_new(0x20);
    ((BaseExpression *)&((OrderModifier *)local_70._8_8_)->super_ResultModifier)->type = 4;
    ((BaseExpression *)&((OrderModifier *)local_70._8_8_)->super_ResultModifier)->
    _vptr_BaseExpression = (_func_int **)&PTR__LimitPercentModifier_01993450;
    (((string *)&((OrderModifier *)local_70._8_8_)->orders)->_M_dataplus)._M_p = (pointer)0x0;
    ((string *)&((OrderModifier *)local_70._8_8_)->orders)->_M_string_length = 0;
    local_70._0_8_ =
         _Var2._M_t.
         super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
         .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl;
    optional_ptr<duckdb_libpgquery::PGLimitPercent,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGLimitPercent,_true> *)local_70);
    TransformExpression((Transformer *)local_70,(optional_ptr<duckdb_libpgquery::PGNode,_true>)this)
    ;
    pLVar5 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
             ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                           *)(local_70 + 8));
    uVar3 = local_70._0_8_;
    local_70._0_8_ =
         (tuple<duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)0x0;
    _Var7._M_head_impl =
         (pLVar5->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar5->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar3;
    if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((OrderModifier *)local_70._0_8_ != (OrderModifier *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 8))();
    }
    if (stmt->limitOffset != (PGNode *)0x0) {
      TransformExpression((Transformer *)local_70,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
      pLVar5 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
               ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                             *)(local_70 + 8));
      uVar3 = local_70._0_8_;
      local_70._0_8_ = (OrderModifier *)0x0;
      _Var7._M_head_impl =
           (pLVar5->offset).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pLVar5->offset).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)uVar3;
      if (_Var7._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>)
          local_70._0_8_ != (OrderModifier *)0x0) {
        (**(code **)(*(long *)local_70._0_8_ + 8))();
      }
    }
    local_70._0_8_ = local_70._8_8_;
    local_70._8_8_ = (OrderModifier *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_70);
  }
  if ((_Head_base<0UL,_duckdb::OrderModifier_*,_false>)local_70._0_8_ !=
      (_Head_base<0UL,_duckdb::OrderModifier_*,_false>)0x0) {
    (*((BaseExpression *)local_70._0_8_)->_vptr_BaseExpression[1])();
  }
  if ((OrderModifier *)local_70._8_8_ != (OrderModifier *)0x0) {
    (*((ResultModifier *)local_70._8_8_)->_vptr_ResultModifier[1])();
  }
LAB_007a9262:
  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_48);
  return;
}

Assistant:

void Transformer::TransformModifiers(duckdb_libpgquery::PGSelectStmt &stmt, QueryNode &node) {
	// transform the common properties
	// both the set operations and the regular select can have an ORDER BY/LIMIT attached to them
	vector<OrderByNode> orders;
	TransformOrderBy(stmt.sortClause, orders);
	if (!orders.empty()) {
		auto order_modifier = make_uniq<OrderModifier>();
		order_modifier->orders = std::move(orders);
		node.modifiers.push_back(std::move(order_modifier));
	}

	if (stmt.limitCount || stmt.limitOffset) {
		if (stmt.limitCount && stmt.limitCount->type == duckdb_libpgquery::T_PGLimitPercent) {
			auto limit_percent_modifier = make_uniq<LimitPercentModifier>();
			auto expr_node = PGPointerCast<duckdb_libpgquery::PGLimitPercent>(stmt.limitCount)->limit_percent;
			limit_percent_modifier->limit = TransformExpression(expr_node);
			if (stmt.limitOffset) {
				limit_percent_modifier->offset = TransformExpression(stmt.limitOffset);
			}
			node.modifiers.push_back(std::move(limit_percent_modifier));
		} else {
			auto limit_modifier = make_uniq<LimitModifier>();
			if (stmt.offset_first) {
				if (stmt.limitOffset) {
					limit_modifier->offset = TransformExpression(stmt.limitOffset);
				}
				if (stmt.limitCount) {
					limit_modifier->limit = TransformExpression(stmt.limitCount);
				}
			} else {
				if (stmt.limitCount) {
					limit_modifier->limit = TransformExpression(stmt.limitCount);
				}
				if (stmt.limitOffset) {
					limit_modifier->offset = TransformExpression(stmt.limitOffset);
				}
			}
			node.modifiers.push_back(std::move(limit_modifier));
		}
	}
}